

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O2

GLuint shader_create(GLchar *shader_source_p,GLenum type)

{
  GLuint GVar1;
  GLchar *shader_source_p_local;
  
  shader_source_p_local = shader_source_p;
  GVar1 = (*glad_glCreateShader)(type);
  (*glad_glShaderSource)(GVar1,1,&shader_source_p_local,(GLint *)0x0);
  (*glad_glCompileShader)(GVar1);
  return GVar1;
}

Assistant:

GLuint shader_create(
        const GLchar* shader_source_p,
        GLenum        type)
{
    GLuint shader = glCreateShader(type);
    glShaderSource(shader, 1, &shader_source_p, 0);
    glCompileShader(shader);

#ifdef DEBUG
    GLint success;
    GLchar log_p[256];
    memset(log_p, 0, 256 * sizeof(GLchar));
    glGetShaderiv(shader, GL_COMPILE_STATUS, &success);
    if (!success)
    {
        glGetShaderInfoLog(shader, 256, NULL, log_p);
        printf("\n\nshader compilation error\n%s\n", log_p);
    }
#endif // DEBUG

    return shader;
}